

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O3

void __thiscall GeometricObject::~GeometricObject(GeometricObject *this)

{
  Texture *pTVar1;
  
  this->_vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00108ac0;
  pTVar1 = (Texture *)this->mapping;
  if (pTVar1 != (Texture *)0x0) goto LAB_0010404f;
  while (pTVar1 = this->material, pTVar1 != (Texture *)0x0) {
    this->material = pTVar1->next;
LAB_0010404f:
    (*pTVar1->_vptr_Texture[1])();
  }
  return;
}

Assistant:

GeometricObject::~GeometricObject()
{
    Texture *m;

    if(mapping) delete mapping;

    for( m = material; m != 0; m = material )
    {
        material = material->next;
        delete m;
    }

//  if(transform) delete transform;
}